

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BaseCase::verifyMessageGroup
          (BaseCase *this,MessageData *message,GLenum source,GLenum type)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  MessageBuilder local_1b0;
  
  pTVar2 = ((this->super_ErrorCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  if ((message->id).source != source) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"Incorrect message source",(allocator<char> *)&local_1d0);
    tcu::ResultCollector::addResult(&this->m_results,QP_TEST_RESULT_FAIL,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Message source was ");
    local_1d0.m_value = (message->id).source;
    local_1d0.m_getName = glu::getDebugMessageSourceName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1," when it should have been ");
    local_1c0.m_getName = glu::getDebugMessageSourceName;
    local_1c0.m_value = source;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  if ((message->id).type != type) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"Incorrect message type",(allocator<char> *)&local_1d0);
    tcu::ResultCollector::addResult(&this->m_results,QP_TEST_RESULT_FAIL,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    poVar1 = &local_1b0.m_str;
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Message type was ");
    local_1d0.m_value = (message->id).type;
    local_1d0.m_getName = glu::getDebugMessageTypeName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1," when it should have been ");
    local_1c0.m_getName = glu::getDebugMessageTypeName;
    local_1c0.m_value = type;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  return;
}

Assistant:

void BaseCase::verifyMessageGroup (const MessageData& message, GLenum source, GLenum type)
{
	TestLog& log = m_testCtx.getLog();

	if (message.id.source != source)
	{
		m_results.addResult(QP_TEST_RESULT_FAIL, "Incorrect message source");
		log << TestLog::Message << "Message source was " << glu::getDebugMessageSourceStr(message.id.source)
			<< " when it should have been "  << glu::getDebugMessageSourceStr(source) << TestLog::EndMessage;
	}

	if (message.id.type != type)
	{
		m_results.addResult(QP_TEST_RESULT_FAIL, "Incorrect message type");
		log << TestLog::Message << "Message type was " << glu::getDebugMessageTypeStr(message.id.type)
			<< " when it should have been " << glu::getDebugMessageTypeStr(type) << TestLog::EndMessage;
	}
}